

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int CVode(void *cvode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  N_Vector *Y;
  realtype *a;
  undefined8 uVar1;
  N_Vector p_Var2;
  N_Vector z;
  byte bVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  realtype *prVar11;
  undefined8 *puVar12;
  double *pdVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long *plVar17;
  ulong uVar18;
  undefined8 *puVar19;
  undefined1 *puVar20;
  char *pcVar21;
  char *msgfmt;
  long lVar22;
  long lVar23;
  bool bVar24;
  realtype rVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  realtype sum;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  double dVar36;
  int iVar39;
  int iVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int npf;
  realtype ssmax [4];
  long nni_inc;
  realtype rav [4];
  realtype sigsq [4];
  realtype qkr [4];
  realtype vrat [5];
  realtype sqmx [4];
  realtype rrc [4];
  realtype drr [4];
  realtype smax [4];
  realtype qjk [4] [4];
  int local_424;
  realtype local_420;
  realtype *local_418;
  N_Vector local_410;
  undefined1 local_408 [16];
  ulong local_3f0;
  double local_3e8;
  realtype *local_3e0;
  undefined8 local_3d8;
  double dStack_3d0;
  int local_3bc;
  double local_3b8;
  ulong local_3a0;
  long local_398;
  undefined8 *local_390;
  void *local_388;
  void *local_380;
  long local_378;
  void *local_370;
  double adStack_368 [4];
  double local_348;
  double local_340 [4];
  double local_320 [4];
  double local_300 [4];
  undefined8 local_2e0 [3];
  double adStack_2c8 [5];
  double local_2a0 [4];
  double local_280 [4];
  double local_260 [7];
  long local_228 [5];
  double local_200;
  double local_1f8;
  double local_1f0;
  double adStack_1e0 [21];
  double adStack_138 [4];
  double adStack_118 [5];
  double adStack_f0 [4];
  double local_d0 [3];
  undefined8 auStack_b8 [5];
  undefined1 local_90 [96];
  undefined1 auVar34 [16];
  
  if (cvode_mem == (void *)0x0) {
    pcVar21 = "cvode_mem = NULL illegal.";
    iVar5 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar4 = -0x15;
    goto LAB_00510c4f;
  }
  if (*(int *)((long)cvode_mem + 0x464) == 0) {
    pcVar21 = "Attempt to call before CVodeInit.";
    iVar5 = -0x17;
    iVar4 = -0x17;
    goto LAB_00510c4f;
  }
  *(N_Vector *)((long)cvode_mem + 0xd0) = yout;
  if (yout == (N_Vector)0x0) {
    pcVar21 = "yout = NULL illegal.";
  }
  else if (tret == (realtype *)0x0) {
    pcVar21 = "tret = NULL illegal.";
  }
  else if (itask - 3U < 0xfffffffe) {
    pcVar21 = "Illegal value for itask.";
  }
  else {
    if (itask == 1) {
      *(realtype *)((long)cvode_mem + 0x5c0) = tout;
    }
    *(int *)((long)cvode_mem + 0x5d0) = itask;
    local_420 = tout;
    if (*(long *)((long)cvode_mem + 0x358) != 0) {
LAB_00510c93:
      if (*(long *)((long)cvode_mem + 0x358) < 1) goto LAB_00510fc2;
      auVar32._0_8_ =
           (ABS(*(double *)((long)cvode_mem + 0x140)) + ABS(*(double *)((long)cvode_mem + 0x168))) *
           *(double *)((long)cvode_mem + 8) * 100.0;
      auVar32._8_8_ = 0;
      if (0 < *(int *)((long)cvode_mem + 0x578)) {
        iVar5 = *(int *)((long)cvode_mem + 0x5d4);
        local_408 = auVar32;
        iVar4 = cvRcheck2((CVodeMem)cvode_mem);
        if (iVar4 == -0xc) {
          pcVar21 = "cvRcheck2";
LAB_005135eb:
          msgfmt = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
          iVar5 = -0xc;
          iVar4 = -0xc;
          goto LAB_005135ff;
        }
        if (iVar4 == 1) {
LAB_00513995:
          rVar25 = *(realtype *)((long)cvode_mem + 0x590);
          *tret = rVar25;
LAB_005139a3:
          *(realtype *)((long)cvode_mem + 0x170) = rVar25;
          return 2;
        }
        if (iVar4 == 3) {
          pcVar21 = "cvRcheck2";
          msgfmt = "Root found at and very near t = %lg.";
          iVar5 = -0x16;
          iVar4 = -0x16;
          goto LAB_005135ff;
        }
        auVar32._0_8_ = (double)local_408._0_8_;
        if ((double)local_408._0_8_ <
            ABS(*(double *)((long)cvode_mem + 0x168) - *(double *)((long)cvode_mem + 0x170))) {
          iVar4 = cvRcheck3((CVodeMem)cvode_mem);
          if (iVar4 == -0xc) {
LAB_005135d5:
            pcVar21 = "cvRcheck3";
            goto LAB_005135eb;
          }
          if (iVar4 == 1) {
            *(undefined4 *)((long)cvode_mem + 0x5d4) = 1;
            goto LAB_00513995;
          }
          auVar32._0_8_ = local_408._0_8_;
          if (((iVar4 == 0) && (*(undefined4 *)((long)cvode_mem + 0x5d4) = 0, itask == 2)) &&
             (iVar5 == 1)) {
            dVar29 = *(double *)((long)cvode_mem + 0x168);
            goto LAB_00510f0d;
          }
        }
      }
      if ((itask != 1) ||
         ((*(double *)((long)cvode_mem + 0x168) - local_420) * *(double *)((long)cvode_mem + 0x140)
          < 0.0)) {
        if ((itask == 2) &&
           (dVar29 = *(double *)((long)cvode_mem + 0x168),
           auVar32._0_8_ < ABS(dVar29 - *(double *)((long)cvode_mem + 0x170)))) {
LAB_00510f0d:
          *tret = dVar29;
          *(double *)((long)cvode_mem + 0x170) = dVar29;
          N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),yout);
          return 0;
        }
        if (*(int *)((long)cvode_mem + 0x110) != 0) {
          dVar29 = *(double *)((long)cvode_mem + 0x118);
          dVar30 = *(double *)((long)cvode_mem + 0x168);
          if (ABS(dVar30 - dVar29) <= auVar32._0_8_) {
            iVar5 = CVodeGetDky(cvode_mem,dVar29,0,yout);
            rVar25 = *(realtype *)((long)cvode_mem + 0x118);
            if (iVar5 == 0) {
              *tret = rVar25;
LAB_0051396f:
              *(realtype *)((long)cvode_mem + 0x170) = rVar25;
              *(undefined4 *)((long)cvode_mem + 0x110) = 0;
              return 1;
            }
LAB_00513630:
            cvProcessError((CVodeMem)cvode_mem,-0x16,"CVODE","CVode",
                           "The value tstop = %lg is behind current t = %lg in the direction of integration."
                          );
            return -0x16;
          }
          if (0.0 < ((*(double *)((long)cvode_mem + 0x148) + dVar30) - dVar29) *
                    *(double *)((long)cvode_mem + 0x140)) {
            auVar32._0_8_ = (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) * (dVar29 - dVar30);
            *(double *)((long)cvode_mem + 0x148) = auVar32._0_8_;
            *(double *)((long)cvode_mem + 0x158) =
                 auVar32._0_8_ / *(double *)((long)cvode_mem + 0x140);
          }
        }
LAB_00510fc2:
        Y = (N_Vector *)((long)cvode_mem + 0x60);
        local_3e0 = (realtype *)((long)cvode_mem + 0x218);
        local_370 = (void *)((long)cvode_mem + 0x228);
        a = (realtype *)((long)cvode_mem + 0x600);
        local_380 = (void *)((long)cvode_mem + 0x188);
        local_388 = (void *)((long)cvode_mem + 0x180);
        local_390 = (undefined8 *)((long)cvode_mem + 0x548);
        local_398 = (long)cvode_mem + 0x4c8;
        lVar23 = 0;
        local_418 = tret;
        local_410 = yout;
        local_3a0 = (ulong)(uint)itask;
LAB_00511039:
        *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x140);
        *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x120);
        if ((0 < *(long *)((long)cvode_mem + 0x358)) &&
           (iVar5 = (**(code **)((long)cvode_mem + 0x48))
                              (*(undefined8 *)((long)cvode_mem + 0x60),
                               *(undefined8 *)((long)cvode_mem + 200),
                               *(undefined8 *)((long)cvode_mem + 0x50)), iVar5 != 0)) {
          pcVar21 = "At t = %lg, a component of ewt has become <= 0.";
          if (*(int *)((long)cvode_mem + 0x24) == 3) {
            pcVar21 = "At t = %lg, the user-provide EwtSet function failed.";
          }
          iVar5 = -0x16;
          iVar4 = -0x16;
LAB_00513697:
          cvProcessError((CVodeMem)cvode_mem,iVar4,"CVODE","CVode",pcVar21);
          goto LAB_0051369e;
        }
        if (*(long *)((long)cvode_mem + 0x2d0) <= lVar23 && 0 < *(long *)((long)cvode_mem + 0x2d0))
        {
          pcVar21 = "At t = %lg, mxstep steps taken before reaching tout.";
          iVar5 = -1;
          iVar4 = -1;
          goto LAB_00513697;
        }
        rVar25 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0x60),
                             *(N_Vector *)((long)cvode_mem + 200));
        auVar32._0_8_ = rVar25 * *(double *)((long)cvode_mem + 8);
        *(double *)((long)cvode_mem + 0x450) = auVar32._0_8_;
        if (1.0 < auVar32._0_8_) {
          cvProcessError((CVodeMem)cvode_mem,-2,"CVODE","CVode",
                         "At t = %lg, too much accuracy requested.",
                         *(undefined8 *)((long)cvode_mem + 0x168));
          rVar25 = *(realtype *)((long)cvode_mem + 0x168);
          *local_418 = rVar25;
          *(realtype *)((long)cvode_mem + 0x170) = rVar25;
          N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),local_410);
          *(double *)((long)cvode_mem + 0x450) =
               *(double *)((long)cvode_mem + 0x450) + *(double *)((long)cvode_mem + 0x450);
          return -2;
        }
        uVar7 = 0;
        *(undefined8 *)((long)cvode_mem + 0x450) = 0x3ff0000000000000;
        auVar32._0_8_ = *(double *)((long)cvode_mem + 0x168);
        dVar29 = auVar32._0_8_ + *(double *)((long)cvode_mem + 0x140);
        if ((dVar29 == auVar32._0_8_) && (!NAN(dVar29) && !NAN(auVar32._0_8_))) {
          iVar5 = *(int *)((long)cvode_mem + 0x390);
          *(int *)((long)cvode_mem + 0x390) = iVar5 + 1;
          if (iVar5 < *(int *)((long)cvode_mem + 0x2d8)) {
            cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                           "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                          );
          }
          uVar7 = (ulong)*(uint *)((long)cvode_mem + 0x390);
          if (*(uint *)((long)cvode_mem + 0x390) == *(uint *)((long)cvode_mem + 0x2d8)) {
            cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                           "The above warning has been issued mxhnil times and will not be issued again for this problem."
                          );
            uVar7 = extraout_RAX;
          }
        }
        local_3bc = 0;
        if (0 < *(long *)((long)cvode_mem + 0x358)) {
          if ((*(double *)((long)cvode_mem + 0x148) != *(double *)((long)cvode_mem + 0x140)) ||
             (NAN(*(double *)((long)cvode_mem + 0x148)) || NAN(*(double *)((long)cvode_mem + 0x140))
             )) {
            iVar5 = *(int *)((long)cvode_mem + 0x124) - *(int *)((long)cvode_mem + 0x120);
            if (iVar5 != 0) {
              cvAdjustOrder((CVodeMem)cvode_mem,iVar5);
              *(int *)((long)cvode_mem + 0x120) = *(int *)((long)cvode_mem + 0x124);
              iVar5 = *(int *)((long)cvode_mem + 0x124) + 1;
              *(int *)((long)cvode_mem + 0x130) = iVar5;
              *(int *)((long)cvode_mem + 300) = iVar5;
            }
            cvRescale((CVodeMem)cvode_mem);
            uVar7 = extraout_RAX_00;
          }
        }
        local_3d8 = (double)CONCAT44(local_3d8._4_4_,(int)CONCAT71((int7)(uVar7 >> 8),1));
        if (*(int *)((long)cvode_mem + 0x5f8) != 0) {
          lVar9 = *(long *)((long)cvode_mem + 0x5f0);
          if (0 < *(long *)(lVar9 + 0x10)) {
            if (*(long *)((long)cvode_mem + 0x358) == 0) {
              local_3d8 = (double)((ulong)local_3d8._4_4_ << 0x20);
            }
            else {
              local_3d8 = (double)CONCAT44(local_3d8._4_4_,
                                           (int)CONCAT71((int7)((ulong)lVar9 >> 8),
                                                         *(long *)((long)cvode_mem + 0x358) <
                                                         *(long *)(lVar9 + 0x10) +
                                                         *(long *)(lVar9 + 0x18)));
            }
          }
        }
        local_408._0_8_ = *(undefined8 *)((long)cvode_mem + 0x168);
        local_424 = 6;
        local_3b8 = (double)((ulong)local_3b8 & 0xffffffff00000000);
        local_3f0 = 0;
        local_378 = lVar23;
LAB_00511252:
        do {
          do {
            auVar32._0_8_ =
                 *(double *)((long)cvode_mem + 0x168) + *(double *)((long)cvode_mem + 0x140);
            *(double *)((long)cvode_mem + 0x168) = auVar32._0_8_;
            if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
               (0.0 < *(double *)((long)cvode_mem + 0x140) *
                      (auVar32._0_8_ - *(double *)((long)cvode_mem + 0x118)))) {
              *(double *)((long)cvode_mem + 0x168) = *(double *)((long)cvode_mem + 0x118);
            }
            uVar7 = (ulong)*(uint *)((long)cvode_mem + 0x120);
            if (0 < (int)*(uint *)((long)cvode_mem + 0x120)) {
              lVar23 = 1;
              do {
                lVar9 = (long)(int)uVar7;
                do {
                  p_Var2 = *(N_Vector *)((long)cvode_mem + lVar9 * 8 + 0x58);
                  N_VLinearSum(1.0,p_Var2,1.0,Y[lVar9],p_Var2);
                  bVar24 = lVar23 < lVar9;
                  lVar9 = lVar9 + -1;
                } while (bVar24);
                uVar7 = (ulong)*(int *)((long)cvode_mem + 0x120);
                bVar24 = lVar23 < (long)uVar7;
                lVar23 = lVar23 + 1;
              } while (bVar24);
            }
            if (*(int *)((long)cvode_mem + 0x20) == 2) {
              *(undefined8 *)((long)cvode_mem + 0x218) = 0x3ff0000000000000;
              *(undefined8 *)((long)cvode_mem + 0x220) = 0x3ff0000000000000;
              uVar14 = *(uint *)((long)cvode_mem + 0x120);
              lVar23 = (long)(int)uVar14;
              uVar7 = (ulong)uVar14;
              if (1 < lVar23) {
                memset(local_370,0,(ulong)(uVar14 - 1) << 3);
              }
              auVar32._0_8_ = *(double *)((long)cvode_mem + 0x140);
              iVar5 = *(int *)((long)cvode_mem + 0x5f8);
              if (-1 < (int)uVar14 && iVar5 != 0) {
                lVar9 = 0;
                do {
                  a[lVar9] = *(realtype *)((long)cvode_mem + lVar9 * 8 + 0x218);
                  lVar9 = lVar9 + 1;
                } while (uVar7 + 1 != lVar9);
              }
              dVar30 = -1.0;
              dVar36 = -1.0;
              dVar42 = 1.0;
              dVar41 = 1.0;
              dVar29 = auVar32._0_8_;
              if (1 < (int)uVar14) {
                dVar30 = -1.0;
                if (uVar14 != 2) {
                  uVar8 = 2;
                  lVar9 = 0x45;
                  dVar30 = -1.0;
                  do {
                    dVar29 = dVar29 + *(double *)((long)cvode_mem + uVar8 * 8 + 0x170);
                    lVar22 = lVar9;
                    do {
                      *(double *)((long)cvode_mem + lVar22 * 8) =
                           *(double *)((long)cvode_mem + (ulong)((int)lVar22 - 0x44) * 8 + 0x218) *
                           (auVar32._0_8_ / dVar29) + *(double *)((long)cvode_mem + lVar22 * 8);
                      lVar16 = lVar22 + -0x43;
                      lVar22 = lVar22 + -1;
                    } while (1 < lVar16);
                    dVar30 = dVar30 + -1.0 / (double)(int)uVar8;
                    uVar8 = uVar8 + 1;
                    lVar9 = lVar9 + 1;
                  } while (uVar8 != uVar7);
                }
                dVar29 = dVar29 + *(double *)((long)cvode_mem + lVar23 * 8 + 0x170);
                dVar36 = *(double *)((long)cvode_mem + 0x220);
                dVar42 = auVar32._0_8_ / dVar29;
                if (iVar5 != 0) {
                  iVar5 = uVar14 + 1;
                  prVar11 = a;
                  do {
                    prVar11[uVar7] = prVar11[uVar14 - 1] * dVar42 + prVar11[uVar7 - 0x7d];
                    iVar5 = iVar5 + -1;
                    prVar11 = prVar11 + -1;
                  } while (1 < iVar5);
                }
                dVar30 = dVar30 + -1.0 / (double)(int)uVar14;
                dVar41 = -dVar36 - dVar30;
                dVar36 = -dVar36 - dVar42;
                iVar5 = uVar14 + 1;
                prVar11 = local_3e0;
                do {
                  prVar11[uVar7] = prVar11[uVar14 - 1] * dVar41 + prVar11[uVar7];
                  iVar5 = iVar5 + -1;
                  prVar11 = prVar11 + -1;
                } while (1 < iVar5);
              }
              dVar26 = (1.0 - dVar36) + dVar30;
              dVar43 = (double)(int)uVar14 * dVar26 + 1.0;
              uVar8 = (ulong)DAT_0077e240;
              dVar26 = (double)((ulong)(dVar26 / (dVar30 * dVar43)) & uVar8);
              *(double *)((long)cvode_mem + 0x1f8) = dVar26;
              *(ulong *)((long)cvode_mem + 0x210) =
                   (ulong)((dVar41 * dVar43) /
                          (*(double *)((long)cvode_mem + lVar23 * 8 + 0x218) * dVar42)) & uVar8;
              if (*(int *)((long)cvode_mem + 300) == 1) {
                dVar44 = 1.0;
                if (1 < (int)uVar14) {
                  dVar44 = 1.0 / (double)(int)uVar14 + dVar30;
                  auVar45._0_8_ = (1.0 - (dVar42 + dVar36)) + dVar44;
                  auVar45._8_8_ = dVar41;
                  auVar46._8_8_ = local_3e0[uVar7];
                  auVar46._0_8_ = dVar44;
                  auVar46 = divpd(auVar45,auVar46);
                  dVar44 = ABS(auVar46._8_8_ * auVar46._0_8_);
                }
                *(double *)((long)cvode_mem + 0x1f0) = dVar44;
                auVar32._0_8_ =
                     auVar32._0_8_ / (dVar29 + *(double *)((long)cvode_mem + lVar23 * 8 + 0x178));
                dVar30 = dVar30 - 1.0 / (double)(int)(uVar14 + 1);
                *(double *)((long)cvode_mem + 0x200) =
                     ABS((((auVar32._0_8_ - dVar36) + 1.0 + dVar30) / dVar43) /
                         ((double)(int)(uVar14 + 2) * auVar32._0_8_ * dVar30));
              }
              dVar26 = *(double *)((long)cvode_mem + 0x2c0) / dVar26;
LAB_0051196f:
              *(double *)((long)cvode_mem + 0x208) = dVar26;
            }
            else if (*(int *)((long)cvode_mem + 0x20) == 1) {
              uVar14 = *(uint *)((long)cvode_mem + 0x120);
              lVar23 = (long)(int)uVar14;
              if (lVar23 == 1) {
                *(undefined8 *)((long)cvode_mem + 0x220) = 0x3ff0000000000000;
                *(undefined8 *)((long)cvode_mem + 0x210) = 0x3ff0000000000000;
                *(undefined8 *)((long)cvode_mem + 0x218) = 0x3ff0000000000000;
                *(undefined8 *)((long)cvode_mem + 0x1f0) = 0x3ff0000000000000;
                *(undefined8 *)((long)cvode_mem + 0x1f8) = 0x3fe0000000000000;
                *(undefined8 *)((long)cvode_mem + 0x200) = 0x3fb5555555555555;
                dVar26 = *(double *)((long)cvode_mem + 0x2c0) + *(double *)((long)cvode_mem + 0x2c0)
                ;
              }
              else {
                uVar7 = (ulong)uVar14;
                local_348 = 1.0;
                auVar32._0_8_ = *(double *)((long)cvode_mem + 0x140);
                if (0 < (int)uVar14) {
                  local_3e8 = *(double *)((long)cvode_mem + 0x140);
                  memset((void *)((long)adStack_368 + 0x28),0,uVar7 * 8);
                  auVar32._0_8_ = local_3e8;
                }
                dVar29 = auVar32._0_8_;
                if (1 < (int)uVar14) {
                  uVar8 = 1;
                  lVar9 = 2;
                  do {
                    if ((uVar8 == uVar14 - 1) && (*(int *)((long)cvode_mem + 300) == 1)) {
                      iVar5 = 1;
                      dVar30 = 0.0;
                      uVar18 = 0;
                      do {
                        dVar30 = dVar30 + (adStack_368[uVar18 + 4] / (double)((int)uVar18 + 2)) *
                                          (double)iVar5;
                        iVar5 = -iVar5;
                        uVar18 = uVar18 + 1;
                      } while (uVar14 - 1 != uVar18);
                      *(double *)((long)cvode_mem + 0x1f0) =
                           (dVar30 * (double)(int)uVar14) / adStack_368[uVar7 + 2];
                    }
                    lVar22 = lVar9;
                    do {
                      adStack_368[lVar22 + 3] =
                           adStack_368[lVar22 + 2] * (auVar32._0_8_ / dVar29) +
                           adStack_368[lVar22 + 3];
                      lVar22 = lVar22 + -1;
                    } while (1 < lVar22);
                    dVar29 = dVar29 + *(double *)((long)cvode_mem + uVar8 * 8 + 0x178);
                    uVar8 = uVar8 + 1;
                    lVar9 = lVar9 + 1;
                  } while (uVar8 != uVar7);
                }
                dVar30 = 0.0;
                dVar36 = 0.0;
                if (0 < (int)uVar14) {
                  iVar5 = 1;
                  uVar8 = 0;
                  do {
                    lVar9 = uVar8 + 4;
                    uVar8 = uVar8 + 1;
                    dVar36 = dVar36 + (adStack_368[lVar9] / (double)(int)uVar8) * (double)iVar5;
                    iVar5 = -iVar5;
                  } while (uVar7 != uVar8);
                }
                if (0 < (int)uVar14) {
                  iVar5 = 1;
                  dVar30 = 0.0;
                  uVar8 = 0;
                  do {
                    dVar30 = dVar30 + (adStack_368[uVar8 + 4] / (double)((int)uVar8 + 2)) *
                                      (double)iVar5;
                    iVar5 = -iVar5;
                    uVar8 = uVar8 + 1;
                  } while (uVar7 != uVar8);
                }
                dVar36 = 1.0 / dVar36;
                *local_3e0 = 1.0;
                if (0 < (int)uVar14) {
                  uVar8 = 0;
                  do {
                    uVar18 = uVar8 + 1;
                    *(double *)((long)cvode_mem + uVar8 * 8 + 0x220) =
                         (adStack_368[uVar8 + 4] / (double)(int)uVar18) * dVar36;
                    uVar8 = uVar18;
                  } while (uVar7 != uVar18);
                }
                dVar29 = dVar29 / auVar32._0_8_;
                dVar26 = (dVar30 * dVar36) / dVar29;
                *(double *)((long)cvode_mem + 0x1f8) = dVar26;
                *(double *)((long)cvode_mem + 0x210) =
                     dVar29 / *(double *)((long)cvode_mem + lVar23 * 8 + 0x218);
                if (*(int *)((long)cvode_mem + 300) == 1) {
                  if (0 < (int)uVar14) {
                    lVar23 = lVar23 + 1;
                    do {
                      adStack_368[lVar23 + 3] =
                           adStack_368[lVar23 + 2] * (1.0 / dVar29) + adStack_368[lVar23 + 3];
                      lVar23 = lVar23 + -1;
                    } while (1 < lVar23);
                  }
                  if ((int)uVar14 < 0) {
                    auVar32._0_8_ = 0.0;
                  }
                  else {
                    iVar5 = 1;
                    auVar32._0_8_ = 0.0;
                    lVar23 = 0;
                    do {
                      auVar32._0_8_ =
                           auVar32._0_8_ +
                           (adStack_368[lVar23 + 4] / (double)((int)lVar23 + 2)) * (double)iVar5;
                      iVar5 = -iVar5;
                      lVar23 = lVar23 + 1;
                    } while (uVar7 + 1 != lVar23);
                  }
                  *(double *)((long)cvode_mem + 0x200) =
                       (dVar36 * auVar32._0_8_) / (double)*(int *)((long)cvode_mem + 0x130);
                }
                dVar26 = *(double *)((long)cvode_mem + 0x2c0) / dVar26;
              }
              goto LAB_0051196f;
            }
            dVar29 = 1.0;
            auVar32._0_8_ = 1.0 / *(double *)((long)cvode_mem + 0x220);
            *(double *)((long)cvode_mem + 0x280) = auVar32._0_8_;
            auVar32._0_8_ = auVar32._0_8_ * *(double *)((long)cvode_mem + 0x140);
            *(double *)((long)cvode_mem + 0x288) = auVar32._0_8_;
            lVar23 = *(long *)((long)cvode_mem + 0x358);
            if (lVar23 == 0) {
              *(double *)((long)cvode_mem + 0x290) = auVar32._0_8_;
            }
            if (0 < lVar23) {
              dVar29 = auVar32._0_8_ / *(double *)((long)cvode_mem + 0x290);
            }
            *(double *)((long)cvode_mem + 0x298) = dVar29;
            local_348 = 0.0;
            local_228[0] = 0;
            if (*(long *)((long)cvode_mem + 0x3f0) == 0) {
              *(undefined8 *)((long)cvode_mem + 0x2a0) = 0x3ff0000000000000;
              uVar14 = 0;
            }
            else {
              iVar5 = (uint)(local_424 != 9) * 2;
              if (local_424 == 6) {
                iVar5 = 0;
              }
              *(int *)((long)cvode_mem + 0x3e0) = iVar5;
              uVar14 = 1;
              if ((((local_424 != 7) && (local_424 != 9)) && (lVar23 != 0)) &&
                 (lVar23 < *(long *)((long)cvode_mem + 0x410) + *(long *)((long)cvode_mem + 0x428)))
              {
                uVar14 = (uint)(*(double *)((long)cvode_mem + 0x418) <= ABS(dVar29 + -1.0) &&
                               ABS(dVar29 + -1.0) != *(double *)((long)cvode_mem + 0x418));
              }
            }
            N_VConst(0.0,*(N_Vector *)((long)cvode_mem + 0xd8));
            if ((*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8))->ops->setup ==
                (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0) {
LAB_00511aa1:
              iVar4 = SUNNonlinSolSolve(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),
                                        *(N_Vector *)((long)cvode_mem + 0x60),
                                        *(N_Vector *)((long)cvode_mem + 0xd8),
                                        *(N_Vector *)((long)cvode_mem + 200),
                                        *(realtype *)((long)cvode_mem + 0x208),uVar14,cvode_mem);
              SUNNonlinSolGetNumIters
                        (*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),(long *)(adStack_368 + 4))
              ;
              *(long *)((long)cvode_mem + 0x370) =
                   *(long *)((long)cvode_mem + 0x370) + (long)local_348;
              SUNNonlinSolGetNumConvFails
                        (*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),local_228);
              *(long *)((long)cvode_mem + 0x378) = *(long *)((long)cvode_mem + 0x378) + local_228[0]
              ;
              if (iVar4 == 0) {
                N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0x60),1.0,
                             *(N_Vector *)((long)cvode_mem + 0xd8),
                             *(N_Vector *)((long)cvode_mem + 0xd0));
                if (*(int *)((long)cvode_mem + 0x2b8) == 0) {
                  rVar25 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0xd8),
                                       *(N_Vector *)((long)cvode_mem + 200));
                  *(realtype *)((long)cvode_mem + 0x2b0) = rVar25;
                }
                *(undefined4 *)((long)cvode_mem + 0x448) = 0;
                iVar4 = 0;
                if (*(int *)((long)cvode_mem + 0x58) != 0) {
                  p_Var2 = *(N_Vector *)((long)cvode_mem + 0xe8);
                  z = *(N_Vector *)((long)cvode_mem + 0xe0);
                  iVar5 = N_VConstrMask(*(N_Vector *)((long)cvode_mem + 0x108),
                                        *(N_Vector *)((long)cvode_mem + 0xd0),p_Var2);
                  if (iVar5 == 0) {
                    N_VCompare(1.5,*(N_Vector *)((long)cvode_mem + 0x108),z);
                    N_VProd(z,*(N_Vector *)((long)cvode_mem + 0x108),z);
                    N_VDiv(z,*(N_Vector *)((long)cvode_mem + 200),z);
                    N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0xd0),-0.1,z,z);
                    N_VProd(z,p_Var2,z);
                    rVar25 = N_VWrmsNorm(z,*(N_Vector *)((long)cvode_mem + 200));
                    if (rVar25 <= *(double *)((long)cvode_mem + 0x208)) {
                      N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),-1.0,z,
                                   *(N_Vector *)((long)cvode_mem + 0xd8));
                      iVar4 = 0;
                    }
                    else {
                      iVar4 = -0xf;
                      if (*(double *)((long)cvode_mem + 0x2e8) * 1.000001 <
                          ABS(*(double *)((long)cvode_mem + 0x140))) {
                        N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0x60),-1.0,
                                     *(N_Vector *)((long)cvode_mem + 0xd0),z);
                        N_VProd(p_Var2,z,z);
                        rVar25 = N_VMinQuotient(*(N_Vector *)((long)cvode_mem + 0x60),z);
                        auVar32._0_8_ = rVar25 * 0.9;
                        if (auVar32._0_8_ <= 0.1) {
                          auVar32._0_8_ = 0.1;
                        }
                        dVar29 = *(double *)((long)cvode_mem + 0x2e8) /
                                 ABS(*(double *)((long)cvode_mem + 0x140));
                        if (auVar32._0_8_ <= dVar29) {
                          auVar32._0_8_ = dVar29;
                        }
                        *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_;
                        iVar4 = 0xb;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar5 = SUNNonlinSolSetup(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),
                                        *(N_Vector *)((long)cvode_mem + 0xd8),cvode_mem);
              if (iVar5 < 0) {
                iVar4 = -0xe;
              }
              else {
                iVar4 = 0x386;
                if (iVar5 == 0) goto LAB_00511aa1;
              }
            }
            local_424 = iVar4;
            if (iVar4 == 0) {
              iVar4 = 2;
            }
            else {
              *(long *)((long)cvode_mem + 0x368) = *(long *)((long)cvode_mem + 0x368) + 1;
              cvRestore((CVodeMem)cvode_mem,(realtype)local_408._0_8_);
              if (iVar4 < 0) {
                if (2 < iVar4 + 8U) {
                  iVar4 = -0x10;
                }
              }
              else {
                iVar5 = local_3b8._0_4_ + 1;
                local_3b8 = (double)CONCAT44(local_3b8._4_4_,iVar5);
                *(undefined8 *)((long)cvode_mem + 0x2f8) = 0x3ff0000000000000;
                if ((ABS(*(double *)((long)cvode_mem + 0x140)) <=
                     *(double *)((long)cvode_mem + 0x2e8) * 1.000001) ||
                   (iVar5 == *(int *)((long)cvode_mem + 0x2e0))) {
                  if (iVar4 == 10) {
                    iVar4 = -10;
                  }
                  else if (iVar4 == 0x386) {
                    iVar4 = -4;
                  }
                  else {
                    if (iVar4 != 0xb) goto LAB_00511daf;
                    iVar4 = -0xf;
                  }
                }
                else {
                  if (iVar4 != 0xb) {
LAB_00511daf:
                    dVar29 = *(double *)((long)cvode_mem + 0x2e8) /
                             ABS(*(double *)((long)cvode_mem + 0x140));
                    auVar32._0_8_ = *(double *)((long)cvode_mem + 0x340);
                    if (*(double *)((long)cvode_mem + 0x340) <= dVar29) {
                      auVar32._0_8_ = dVar29;
                    }
                    *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_;
                  }
                  local_424 = 7;
                  cvRescale((CVodeMem)cvode_mem);
                  iVar4 = 3;
                }
              }
            }
          } while (iVar4 == 3);
          if (iVar4 != 2) goto LAB_00512d5e;
          *(undefined4 *)((long)cvode_mem + 0x5fc) = 0;
          if ((char)local_3d8 == '\0') {
            iVar4 = cvDoProjection((CVodeMem)cvode_mem,&local_424,(realtype)local_408._0_8_,
                                   &local_3bc);
            if (iVar4 == 3) goto LAB_00511252;
            if (iVar4 != 0) goto LAB_00512d5e;
          }
          local_3e8 = *(double *)((long)cvode_mem + 0x2b0) * *(double *)((long)cvode_mem + 0x1f8);
          iVar4 = 0;
          if (local_3e8 <= 1.0) {
            uVar7 = local_3f0 & 0xffffffff;
          }
          else {
            uVar14 = (int)local_3f0 + 1;
            uVar7 = (ulong)uVar14;
            *(long *)((long)cvode_mem + 0x380) = *(long *)((long)cvode_mem + 0x380) + 1;
            local_424 = 9;
            cvRestore((CVodeMem)cvode_mem,(realtype)local_408._0_8_);
            auVar32._0_8_ = ABS(*(double *)((long)cvode_mem + 0x140));
            iVar4 = -3;
            if ((*(double *)((long)cvode_mem + 0x2e8) * 1.000001 < auVar32._0_8_) &&
               (uVar14 != *(uint *)((long)cvode_mem + 0x2dc))) {
              *(undefined8 *)((long)cvode_mem + 0x2f8) = 0x3ff0000000000000;
              if ((int)local_3f0 < 3) {
                rVar25 = SUNRpowerR(local_3e8 * 6.0,1.0 / (double)*(int *)((long)cvode_mem + 0x130))
                ;
                auVar27._0_8_ = rVar25 + 1e-06;
                auVar27._8_8_ = *(ulong *)((long)cvode_mem + 0x140) & 0x7fffffffffffffff;
                auVar31._8_8_ = *(undefined8 *)((long)cvode_mem + 0x2e8);
                auVar31._0_8_ = 0x3ff0000000000000;
                auVar32 = divpd(auVar31,auVar27);
                auVar32._0_8_ = auVar32._0_8_;
                if (auVar32._0_8_ <= auVar32._8_8_) {
                  auVar32._0_8_ = auVar32._8_8_;
                }
                dVar29 = *(double *)((long)cvode_mem + 0x330);
                if (*(double *)((long)cvode_mem + 0x330) <= auVar32._0_8_) {
                  dVar29 = auVar32._0_8_;
                }
                *(double *)((long)cvode_mem + 0x158) = dVar29;
                if (*(int *)((long)cvode_mem + 0x350) <= (int)uVar14) {
                  if (*(double *)((long)cvode_mem + 0x338) <= dVar29) {
                    dVar29 = *(double *)((long)cvode_mem + 0x338);
                  }
                  *(double *)((long)cvode_mem + 0x158) = dVar29;
                }
LAB_00512012:
                cvRescale((CVodeMem)cvode_mem);
              }
              else {
                auVar32._0_8_ = *(double *)((long)cvode_mem + 0x2e8) / auVar32._0_8_;
                dVar29 = *(double *)((long)cvode_mem + 0x330);
                if (*(double *)((long)cvode_mem + 0x330) <= auVar32._0_8_) {
                  dVar29 = auVar32._0_8_;
                }
                *(double *)((long)cvode_mem + 0x158) = dVar29;
                if (1 < *(int *)((long)cvode_mem + 0x120)) {
                  cvAdjustOrder((CVodeMem)cvode_mem,-1);
                  iVar5 = *(int *)((long)cvode_mem + 0x120);
                  *(int *)((long)cvode_mem + 0x130) = iVar5;
                  *(int *)((long)cvode_mem + 0x120) = iVar5 + -1;
                  *(int *)((long)cvode_mem + 300) = iVar5;
                  goto LAB_00512012;
                }
                dVar29 = *(double *)((long)cvode_mem + 0x140) * dVar29;
                *(double *)((long)cvode_mem + 0x140) = dVar29;
                *(double *)((long)cvode_mem + 0x150) = dVar29;
                *(double *)((long)cvode_mem + 0x160) = dVar29;
                *(undefined4 *)((long)cvode_mem + 300) = 10;
                *(undefined4 *)((long)cvode_mem + 0x560) = 0;
                iVar5 = (**(code **)((long)cvode_mem + 0x10))
                                  (*(undefined8 *)((long)cvode_mem + 0x168),
                                   *(undefined8 *)((long)cvode_mem + 0x60),
                                   *(undefined8 *)((long)cvode_mem + 0xe0),
                                   *(undefined8 *)((long)cvode_mem + 0x18));
                *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
                if (iVar5 < 0) {
                  iVar4 = -8;
                  goto LAB_00512029;
                }
                iVar4 = -0xb;
                if (iVar5 != 0) goto LAB_00512029;
                N_VScale(*(realtype *)((long)cvode_mem + 0x140),
                         *(N_Vector *)((long)cvode_mem + 0xe0),*(N_Vector *)((long)cvode_mem + 0x68)
                        );
              }
              iVar4 = 5;
            }
          }
LAB_00512029:
          local_3f0 = uVar7;
        } while (iVar4 == 5);
        if (iVar4 == 0) {
          lVar23 = *(long *)((long)cvode_mem + 0x358);
          *(long *)((long)cvode_mem + 0x358) = lVar23 + 1;
          *(int *)((long)cvode_mem + 0x560) = *(int *)((long)cvode_mem + 0x560) + 1;
          uVar1 = *(undefined8 *)((long)cvode_mem + 0x140);
          *(undefined8 *)((long)cvode_mem + 0x438) = uVar1;
          iVar5 = *(int *)((long)cvode_mem + 0x120);
          *(int *)((long)cvode_mem + 0x420) = iVar5;
          if (1 < (long)iVar5) {
            local_408._0_8_ = uVar1;
            memmove(local_380,local_388,(long)iVar5 * 8 - 8);
            uVar1 = local_408._0_8_;
          }
          if (0 < lVar23 && iVar5 == 1) {
            *(undefined8 *)((long)cvode_mem + 0x188) = *(undefined8 *)((long)cvode_mem + 0x180);
          }
          *(undefined8 *)((long)cvode_mem + 0x180) = uVar1;
          N_VScaleAddMulti(iVar5 + 1,local_3e0,*(N_Vector *)((long)cvode_mem + 0xd8),Y,Y);
          if (*(int *)((long)cvode_mem + 0x5fc) != 0) {
            N_VScaleAddMulti(*(int *)((long)cvode_mem + 0x120) + 1,a,
                             *(N_Vector *)((long)cvode_mem + 0xe0),Y,Y);
          }
          iVar5 = *(int *)((long)cvode_mem + 300) + -1;
          *(int *)((long)cvode_mem + 300) = iVar5;
          if ((iVar5 == 1) &&
             (*(int *)((long)cvode_mem + 0x120) != *(int *)((long)cvode_mem + 0x2c8))) {
            N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),
                     *(N_Vector *)
                      ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
            *(undefined8 *)((long)cvode_mem + 0x440) = *(undefined8 *)((long)cvode_mem + 0x210);
            *(undefined4 *)((long)cvode_mem + 0x45c) = *(undefined4 *)((long)cvode_mem + 0x2c8);
          }
          if ((*(double *)((long)cvode_mem + 0x2f8) != 1.0) ||
             (NAN(*(double *)((long)cvode_mem + 0x2f8)))) {
            rVar25 = SUNRpowerR(local_3e8 * 6.0,1.0 / (double)*(int *)((long)cvode_mem + 0x130));
            auVar32._0_8_ = 1.0 / (rVar25 + 1e-06);
            *(double *)((long)cvode_mem + 0x3a0) = auVar32._0_8_;
            if (*(int *)((long)cvode_mem + 300) == 0) {
              *(undefined4 *)((long)cvode_mem + 300) = 2;
              *(undefined8 *)((long)cvode_mem + 0x398) = 0;
              if (1 < (long)*(int *)((long)cvode_mem + 0x120)) {
                rVar25 = N_VWrmsNorm(*(N_Vector *)
                                      ((long)cvode_mem +
                                      (long)*(int *)((long)cvode_mem + 0x120) * 8 + 0x60),
                                     *(N_Vector *)((long)cvode_mem + 200));
                rVar25 = SUNRpowerR(rVar25 * *(double *)((long)cvode_mem + 0x1f0) * 6.0,
                                    1.0 / (double)*(int *)((long)cvode_mem + 0x120));
                *(double *)((long)cvode_mem + 0x398) = 1.0 / (rVar25 + 1e-06);
              }
              *(undefined8 *)((long)cvode_mem + 0x3a8) = 0;
              if (*(int *)((long)cvode_mem + 0x120) == *(int *)((long)cvode_mem + 0x2c8)) {
LAB_00512431:
                dVar29 = *(double *)((long)cvode_mem + 0x3a8);
              }
              else {
                auVar32._0_8_ = *(double *)((long)cvode_mem + 0x440);
                dVar29 = 0.0;
                if ((auVar32._0_8_ != 0.0) || (NAN(auVar32._0_8_))) {
                  local_408._8_8_ = 0;
                  local_408._0_8_ = *(ulong *)((long)cvode_mem + 0x210);
                  local_3b8 = auVar32._0_8_;
                  rVar25 = SUNRpowerI(*(double *)((long)cvode_mem + 0x140) /
                                      *(double *)((long)cvode_mem + 0x188),
                                      *(int *)((long)cvode_mem + 0x130));
                  N_VLinearSum(rVar25 * (-(double)local_408._0_8_ / local_3b8),
                               *(N_Vector *)
                                ((long)cvode_mem +
                                (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60),1.0,
                               *(N_Vector *)((long)cvode_mem + 0xd8),
                               *(N_Vector *)((long)cvode_mem + 0xe0));
                  rVar25 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0xe0),
                                       *(N_Vector *)((long)cvode_mem + 200));
                  rVar25 = SUNRpowerR(rVar25 * *(double *)((long)cvode_mem + 0x200) * 10.0,
                                      1.0 / (double)(*(int *)((long)cvode_mem + 0x130) + 1));
                  *(double *)((long)cvode_mem + 0x3a8) = 1.0 / (rVar25 + 1e-06);
                  goto LAB_00512431;
                }
              }
              *(double *)((long)cvode_mem + 0x3a8) = dVar29;
              auVar32._0_8_ = *(double *)((long)cvode_mem + 0x398);
              dVar30 = *(double *)((long)cvode_mem + 0x3a0);
              dVar36 = dVar30;
              if (dVar30 <= dVar29) {
                dVar36 = dVar29;
              }
              dVar42 = auVar32._0_8_;
              if (auVar32._0_8_ <= dVar36) {
                dVar42 = dVar36;
              }
              if ((*(double *)((long)cvode_mem + 0x300) <= dVar42 &&
                   dVar42 != *(double *)((long)cvode_mem + 0x300)) &&
                 (dVar42 < *(double *)((long)cvode_mem + 0x308))) {
                *(undefined8 *)((long)cvode_mem + 0x158) = 0x3ff0000000000000;
                goto LAB_005124a4;
              }
              if ((dVar42 == dVar30) && (!NAN(dVar42) && !NAN(dVar30))) {
                *(double *)((long)cvode_mem + 0x158) = dVar30;
                goto LAB_005124a4;
              }
              if ((dVar42 == auVar32._0_8_) && (!NAN(dVar42) && !NAN(auVar32._0_8_))) {
                *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_;
                iVar5 = *(int *)((long)cvode_mem + 0x120) + -1;
                goto LAB_005124aa;
              }
              *(double *)((long)cvode_mem + 0x158) = dVar29;
              *(int *)((long)cvode_mem + 0x124) = *(int *)((long)cvode_mem + 0x120) + 1;
              if (*(int *)((long)cvode_mem + 0x20) == 2) {
                N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),
                         *(N_Vector *)
                          ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
              }
            }
            else {
              *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_;
LAB_005124a4:
              iVar5 = *(int *)((long)cvode_mem + 0x120);
LAB_005124aa:
              *(int *)((long)cvode_mem + 0x124) = iVar5;
            }
            cvSetEta((CVodeMem)cvode_mem);
          }
          else {
            iVar5 = *(int *)((long)cvode_mem + 300);
            if (iVar5 < 3) {
              iVar5 = 2;
            }
            *(int *)((long)cvode_mem + 300) = iVar5;
            *(undefined4 *)((long)cvode_mem + 0x124) = *(undefined4 *)((long)cvode_mem + 0x120);
            *(undefined8 *)((long)cvode_mem + 0x148) = *(undefined8 *)((long)cvode_mem + 0x140);
            *(undefined8 *)((long)cvode_mem + 0x158) = 0x3ff0000000000000;
          }
          auVar32 = _DAT_00799430;
          if (*(int *)((long)cvode_mem + 0x498) != 0) {
            iVar5 = *(int *)((long)cvode_mem + 0x120);
            if (2 < (long)iVar5) {
              lVar23 = 1;
              puVar12 = local_390;
              do {
                uVar7 = 6;
                puVar19 = puVar12;
                do {
                  *puVar19 = puVar19[-4];
                  puVar19 = puVar19 + -4;
                  uVar7 = uVar7 - 1;
                } while (2 < uVar7);
                lVar23 = lVar23 + 1;
                puVar12 = puVar12 + 1;
              } while (lVar23 != 4);
              iVar4 = iVar5 + -2;
              auVar28._4_4_ = iVar4;
              auVar28._0_4_ = iVar4;
              auVar28._8_4_ = iVar4;
              auVar28._12_4_ = iVar4;
              iVar35 = 1;
              iVar39 = 2;
              uVar14 = 3;
              iVar40 = 4;
              auVar33 = _DAT_00799410;
              iVar4 = 4;
              do {
                auVar46 = auVar33;
                auVar33._0_4_ = auVar46._0_4_ * iVar35;
                auVar34._8_4_ = (undefined4)((auVar46._8_8_ & 0xffffffff) * (ulong)uVar14);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar33._0_4_;
                auVar34._12_4_ = auVar46._12_4_ * iVar40;
                auVar33._8_8_ = auVar34._8_8_;
                auVar33._4_4_ = auVar46._4_4_ * iVar39;
                iVar35 = iVar35 + auVar32._0_4_;
                iVar39 = iVar39 + auVar32._4_4_;
                uVar14 = uVar14 + auVar32._8_4_;
                iVar40 = iVar40 + auVar32._12_4_;
                iVar10 = iVar4 + -4;
                iVar15 = iVar4 + (iVar5 + 2U & 0xfffffffc);
                iVar4 = iVar10;
              } while (iVar15 != 8);
              iVar10 = -iVar10;
              auVar37._4_4_ = iVar10;
              auVar37._0_4_ = iVar10;
              auVar37._8_4_ = iVar10;
              auVar37._12_4_ = iVar10;
              auVar28 = auVar28 ^ _DAT_0077bb40;
              auVar32 = (auVar37 | _DAT_00799440) ^ _DAT_0077bb40;
              auVar38._0_4_ = -(uint)(auVar28._0_4_ < auVar32._0_4_);
              auVar38._4_4_ = -(uint)(auVar28._4_4_ < auVar32._4_4_);
              auVar38._8_4_ = -(uint)(auVar28._8_4_ < auVar32._8_4_);
              auVar38._12_4_ = -(uint)(auVar28._12_4_ < auVar32._12_4_);
              auVar32 = ~auVar38 & auVar33 | auVar46 & auVar38;
              iVar35 = auVar32._8_4_ * auVar32._0_4_ * auVar32._4_4_ * auVar32._12_4_;
              iVar4 = iVar35 * iVar5;
              auVar32._0_8_ = *(double *)((long)cvode_mem + 0x210);
              if (auVar32._0_8_ <= 1e-10) {
                auVar32._0_8_ = 1e-10;
              }
              local_408._0_8_ =
                   ((double)((iVar5 + 1) * iVar4) * *(double *)((long)cvode_mem + 0x2b0)) /
                   auVar32._0_8_;
              local_3d8 = (double)iVar4;
              dStack_3d0 = 0.0;
              local_3b8 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + (long)iVar5 * 8 + 0x60),
                                      *(N_Vector *)((long)cvode_mem + 200));
              dStack_3d0 = local_3d8;
              local_3d8 = (double)iVar35;
              rVar25 = N_VWrmsNorm(*(N_Vector *)
                                    ((long)cvode_mem +
                                    (long)*(int *)((long)cvode_mem + 0x120) * 8 + 0x58),
                                   *(N_Vector *)((long)cvode_mem + 200));
              *(double *)((long)cvode_mem + 0x4c8) = rVar25 * local_3d8 * rVar25 * local_3d8;
              *(double *)((long)cvode_mem + 0x4d0) = local_3b8 * dStack_3d0 * local_3b8 * dStack_3d0
              ;
              *(double *)((long)cvode_mem + 0x4d8) =
                   (double)local_408._0_8_ * (double)local_408._0_8_;
            }
            iVar5 = *(int *)((long)cvode_mem + 0x120);
            if (*(int *)((long)cvode_mem + 0x124) < iVar5) {
              *(undefined4 *)((long)cvode_mem + 0x560) = 0;
              goto LAB_00512d17;
            }
            if ((iVar5 < 3) || (*(int *)((long)cvode_mem + 0x560) < iVar5 + 5)) goto LAB_00512d17;
            lVar9 = 1;
            pdVar13 = adStack_368 + 4;
            plVar17 = local_228;
            lVar23 = local_398;
            do {
              auVar32._0_8_ = *(double *)((long)cvode_mem + lVar9 * 8 + 0x4c0);
              dVar29 = 0.0;
              lVar22 = 0;
              dVar30 = auVar32._0_8_;
              do {
                dVar36 = *(double *)(lVar23 + lVar22);
                if (dVar36 <= dVar30) {
                  dVar30 = dVar36;
                }
                if (dVar29 <= dVar36) {
                  dVar29 = dVar36;
                }
                lVar22 = lVar22 + 0x20;
              } while (lVar22 != 0xa0);
              if (dVar30 < dVar29 * 1e-10) goto LAB_00512b13;
              adStack_f0[lVar9 + 3] = dVar29;
              adStack_368[lVar9] = dVar29 * dVar29;
              dVar29 = 0.0;
              lVar22 = 0;
              dVar30 = 0.0;
              do {
                dVar36 = *(double *)(lVar23 + lVar22) / *(double *)(lVar23 + 0x20 + lVar22);
                dVar29 = dVar29 + dVar36;
                dVar30 = dVar30 + dVar36 * dVar36;
                lVar22 = lVar22 + 0x20;
              } while (lVar22 != 0x80);
              dVar29 = dVar29 * 0.25;
              adStack_2c8[lVar9 + 8] = dVar29;
              adStack_1e0[lVar9 + 0xf] = ABS(dVar30 * 0.25 - dVar29 * dVar29);
              dVar29 = *(double *)((long)cvode_mem + lVar9 * 8 + 0x4e0);
              dVar30 = *(double *)((long)cvode_mem + lVar9 * 8 + 0x500);
              adStack_2c8[lVar9 + 4] = auVar32._0_8_ * dVar30 - dVar29 * dVar29;
              dVar36 = *(double *)((long)cvode_mem + lVar9 * 8 + 0x520);
              adStack_2c8[lVar9] = dVar29 * dVar30 - auVar32._0_8_ * dVar36;
              *(undefined8 *)((long)adStack_368 + (lVar9 + 0xb) * 8 + 0x28U) = 0;
              auVar32._0_8_ = *(double *)((long)cvode_mem + lVar9 * 8 + 0x540);
              *(double *)((long)adStack_368 + (lVar9 + 7) * 8 + 0x28U) =
                   dVar29 * auVar32._0_8_ - dVar36 * dVar30;
              *(double *)((long)adStack_368 + (lVar9 + 3) * 8 + 0x28U) =
                   dVar36 * dVar36 - auVar32._0_8_ * dVar30;
              lVar22 = 0x28;
              do {
                *(undefined8 *)((long)plVar17 + lVar22) = *(undefined8 *)((long)pdVar13 + lVar22);
                lVar22 = lVar22 + 0x20;
              } while (lVar22 != 200);
              lVar9 = lVar9 + 1;
              lVar23 = lVar23 + 8;
              plVar17 = plVar17 + 1;
              pdVar13 = pdVar13 + 1;
            } while (lVar9 != 4);
            auVar32._0_8_ = adStack_1e0[0x11];
            if (adStack_1e0[0x12] <= adStack_1e0[0x11]) {
              auVar32._0_8_ = adStack_1e0[0x12];
            }
            dVar29 = adStack_1e0[0x10];
            if (auVar32._0_8_ <= adStack_1e0[0x10]) {
              dVar29 = auVar32._0_8_;
            }
            uVar7 = (ulong)DAT_0077e240;
            if (1e-08 <= dVar29) {
              if (ABS(local_200) < adStack_368[1] * 1e-10) goto LAB_00512ca4;
              lVar23 = 0;
              do {
                *(double *)((long)adStack_1e0 + lVar23 + 8) =
                     *(double *)((long)adStack_1e0 + lVar23) * (-local_1f8 / local_200) +
                     *(double *)((long)adStack_1e0 + lVar23 + 8);
                lVar23 = lVar23 + 0x20;
              } while (lVar23 != 0x80);
              local_1f8 = 0.0;
              lVar23 = 0;
              do {
                *(double *)((long)adStack_1e0 + lVar23 + 0x10) =
                     *(double *)((long)adStack_1e0 + lVar23) * (-local_1f0 / local_200) +
                     *(double *)((long)adStack_1e0 + lVar23 + 0x10);
                lVar23 = lVar23 + 0x20;
              } while (lVar23 != 0x80);
              local_1f0 = 0.0;
              if (ABS(adStack_1e0[1]) < adStack_368[2] * 1e-10) goto LAB_00512ca4;
              lVar23 = 0;
              do {
                *(double *)((long)adStack_1e0 + lVar23 + 0x30) =
                     *(double *)((long)adStack_1e0 + lVar23 + 0x28) *
                     (-adStack_1e0[2] / adStack_1e0[1]) +
                     *(double *)((long)adStack_1e0 + lVar23 + 0x30);
                lVar23 = lVar23 + 0x20;
              } while (lVar23 != 0x60);
              if (ABS(adStack_1e0[10]) < adStack_368[3] * 1e-10) goto LAB_00512ca4;
              auVar32._0_8_ = -adStack_1e0[0xe] / adStack_1e0[10];
              bVar24 = false;
              if (auVar32._0_8_ < 1e-10) goto LAB_00512ca4;
              if (auVar32._0_8_ <= 100.0) {
                lVar23 = 0;
                do {
                  local_260[lVar23 + 4] =
                       ((*(double *)((long)adStack_368 + (lVar23 + 4) * 8 + 0x28U) * auVar32._0_8_ +
                        *(double *)((long)adStack_368 + (lVar23 + 8) * 8 + 0x28U)) *
                        auVar32._0_8_ * auVar32._0_8_ + adStack_2c8[lVar23 + 1]) * auVar32._0_8_ +
                       adStack_2c8[lVar23 + 5];
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 3);
                lVar23 = 1;
                dVar29 = 0.0;
                do {
                  dVar30 = ABS(local_260[lVar23 + 3]) / adStack_368[lVar23];
                  if (ABS(local_260[lVar23 + 3]) / adStack_368[lVar23] <= dVar29) {
                    dVar30 = dVar29;
                  }
                  lVar23 = lVar23 + 1;
                  dVar29 = dVar30;
                } while (lVar23 != 4);
                iVar4 = 2;
                bVar3 = 1;
                if (0.001 <= dVar30) {
                  uVar8 = 0;
                  iVar4 = 1;
                  do {
                    lVar23 = 0;
                    do {
                      dVar29 = (*(double *)((long)local_300 + lVar23) * 3.0 +
                               *(double *)((long)local_320 + lVar23) * auVar32._0_8_ * 4.0) *
                               auVar32._0_8_ * auVar32._0_8_ +
                               *(double *)((long)adStack_2c8 + lVar23 + 8);
                      *(undefined8 *)((long)adStack_f0 + lVar23) = 0;
                      if (*(double *)((long)adStack_368 + lVar23 + 8) * 1e-10 <
                          (double)((ulong)dVar29 & uVar7)) {
                        *(double *)((long)adStack_f0 + lVar23) =
                             -*(double *)((long)local_260 + lVar23 + 0x20) / dVar29;
                      }
                      *(double *)((long)adStack_118 + lVar23 + 8) =
                           *(double *)((long)adStack_f0 + lVar23) + auVar32._0_8_;
                      lVar23 = lVar23 + 8;
                    } while (lVar23 != 0x18);
                    lVar23 = 1;
                    puVar20 = local_90;
                    do {
                      auVar32._0_8_ = adStack_118[lVar23];
                      lVar9 = 0;
                      dVar29 = 0.0;
                      do {
                        dVar30 = ((*(double *)((long)local_320 + lVar9) * auVar32._0_8_ +
                                  *(double *)((long)local_300 + lVar9)) *
                                  auVar32._0_8_ * auVar32._0_8_ +
                                 *(double *)((long)adStack_2c8 + lVar9 + 8)) * auVar32._0_8_ +
                                 *(double *)((long)adStack_2c8 + lVar9 + 0x28);
                        *(double *)(puVar20 + lVar9 * 4) = dVar30;
                        dVar30 = (double)((ulong)dVar30 & uVar7) /
                                 *(double *)((long)adStack_368 + lVar9 + 8);
                        if (dVar30 <= dVar29) {
                          dVar30 = dVar29;
                        }
                        lVar9 = lVar9 + 8;
                        dVar29 = dVar30;
                      } while (lVar9 != 0x18);
                      adStack_138[lVar23] = dVar30;
                      lVar23 = lVar23 + 1;
                      puVar20 = puVar20 + 8;
                    } while (lVar23 != 4);
                    dVar29 = adStack_138[1] + 1.0;
                    uVar18 = 1;
                    do {
                      if (adStack_138[uVar18] < dVar29) {
                        uVar8 = uVar18 & 0xffffffff;
                        dVar29 = adStack_138[uVar18];
                      }
                      uVar18 = uVar18 + 1;
                    } while (uVar18 != 4);
                    auVar32._0_8_ = adStack_118[(int)uVar8];
                    if (dVar29 < 0.001) {
                      iVar4 = 3;
                      bVar3 = 1;
                      goto LAB_00513284;
                    }
                    lVar23 = 8;
                    do {
                      *(undefined8 *)((long)local_260 + lVar23 + 0x18) =
                           *(undefined8 *)
                            ((long)adStack_f0 + lVar23 * 4 + (long)(int)uVar8 * 8 + 0x38);
                      lVar23 = lVar23 + 8;
                    } while (lVar23 != 0x20);
                    iVar4 = iVar4 + 1;
                  } while (iVar4 != 4);
                  iVar4 = 0;
                  bVar3 = 0;
LAB_00513284:
                  if (0.001 < dVar29) goto LAB_00512ca4;
                }
LAB_0051292c:
                lVar23 = 0;
                do {
                  dVar30 = *(double *)((long)cvode_mem + lVar23 * 8 + 0x4e8) * auVar32._0_8_;
                  dVar29 = *(double *)((long)cvode_mem + lVar23 * 8 + 0x508);
                  dVar42 = auVar32._0_8_ * dVar29 * auVar32._0_8_;
                  dVar36 = dVar30 - dVar42;
                  if (ABS(dVar36) < adStack_f0[lVar23 + 4] * 1e-10) goto LAB_00512b13;
                  dVar42 = dVar36 - (dVar42 - *(double *)((long)cvode_mem + lVar23 * 8 + 0x528) *
                                              auVar32._0_8_ * auVar32._0_8_ * auVar32._0_8_);
                  dVar36 = -(((*(double *)((long)cvode_mem + lVar23 * 8 + 0x4c8) - dVar30) - dVar36)
                            - dVar42) / dVar36;
                  bVar24 = false;
                  if ((dVar36 < 1e-10) || (4.0 < dVar36)) goto LAB_00512cb6;
                  local_260[lVar23] = dVar29 + (dVar42 / dVar36) / (auVar32._0_8_ * auVar32._0_8_);
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 3);
                if (((local_260[1] < 1e-10) ||
                    (dVar29 = ((double)(iVar5 * iVar5 + -1) * -0.25 * (local_260[2] / local_260[1])
                              + (local_260[0] / local_260[1]) * (local_260[2] / local_260[1]) + -1.0
                              ) * (-2.0 / (double)(iVar5 + -1)) + 1.0, ABS(dVar29) < 1e-10)) ||
                   (bVar24 = false, 0.01 < ABS(1.0 / dVar29 - auVar32._0_8_))) goto LAB_00512ca4;
                if (0.98 < auVar32._0_8_) {
                  bVar24 = (bool)(bVar3 | iVar4 == 1);
                }
              }
            }
            else {
              auVar32._0_8_ = adStack_1e0[0x11];
              if (adStack_1e0[0x11] <= adStack_1e0[0x12]) {
                auVar32._0_8_ = adStack_1e0[0x12];
              }
              dVar29 = adStack_1e0[0x10];
              if (adStack_1e0[0x10] <= auVar32._0_8_) {
                dVar29 = auVar32._0_8_;
              }
              if (dVar29 <= 2.5e-07) {
                auVar32._0_8_ = (local_280[0] + local_280[1] + local_280[2]) / 3.0;
                dVar29 = 0.0;
                lVar23 = 1;
                do {
                  dVar30 = (double)((ulong)(adStack_2c8[lVar23 + 8] - auVar32._0_8_) & uVar7);
                  if (dVar29 <= dVar30) {
                    dVar29 = dVar30;
                  }
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 4);
                iVar4 = 1;
                bVar3 = 0;
                if (dVar29 <= 0.0005) goto LAB_0051292c;
              }
LAB_00512ca4:
              bVar24 = false;
            }
            goto LAB_00512cb6;
          }
          goto LAB_00512d17;
        }
        goto LAB_00512d5e;
      }
      *tret = local_420;
      *(realtype *)((long)cvode_mem + 0x170) = local_420;
      iVar5 = CVodeGetDky(cvode_mem,local_420,0,yout);
      if (iVar5 == 0) {
        return 0;
      }
      pcVar21 = "CVode";
      msgfmt = "Trouble interpolating at tout = %lg. tout too far back in direction of integration";
      iVar5 = -0x16;
      iVar4 = -0x16;
LAB_005135ff:
      cvProcessError((CVodeMem)cvode_mem,iVar4,"CVODE",pcVar21,msgfmt);
      return iVar5;
    }
    rVar25 = *(realtype *)((long)cvode_mem + 0x168);
    *tret = rVar25;
    *(realtype *)((long)cvode_mem + 0x170) = rVar25;
    if (*(int *)((long)cvode_mem + 0x24) == 0) {
      pcVar21 = "No integration tolerances have been specified.";
LAB_00513307:
      iVar5 = -0x16;
      iVar4 = -0x16;
LAB_00513317:
      bVar24 = false;
      cvProcessError((CVodeMem)cvode_mem,iVar4,"CVODE","cvInitialSetup",pcVar21);
    }
    else {
      if (*(int *)((long)cvode_mem + 0x44) == 0) {
        pvVar6 = cvode_mem;
        if ((*(int *)((long)cvode_mem + 0x40) != 0) &&
           (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0xb0) == 0)) {
          pcVar21 = "Missing N_VMin routine from N_Vector";
          goto LAB_00513307;
        }
      }
      else {
        pvVar6 = *(void **)((long)cvode_mem + 0x18);
      }
      *(void **)((long)cvode_mem + 0x50) = pvVar6;
      if ((*(int *)((long)cvode_mem + 0x58) != 0) &&
         (iVar5 = N_VConstrMask(*(N_Vector *)((long)cvode_mem + 0x108),
                                *(N_Vector *)((long)cvode_mem + 0x60),
                                *(N_Vector *)((long)cvode_mem + 0xe0)), iVar5 == 0)) {
        pcVar21 = "y0 fails to satisfy constraints.";
        goto LAB_00513307;
      }
      iVar5 = (**(code **)((long)cvode_mem + 0x48))
                        (*(undefined8 *)((long)cvode_mem + 0x60),
                         *(undefined8 *)((long)cvode_mem + 200),
                         *(undefined8 *)((long)cvode_mem + 0x50));
      if (iVar5 != 0) {
        if (*(int *)((long)cvode_mem + 0x24) == 3) {
          pcVar21 = "The user-provide EwtSet function failed.";
        }
        else {
          pcVar21 = "Initial ewt has component(s) equal to zero (illegal).";
        }
        goto LAB_00513307;
      }
      if ((*(code **)((long)cvode_mem + 1000) != (code *)0x0) &&
         (iVar5 = (**(code **)((long)cvode_mem + 1000))(cvode_mem), iVar5 != 0)) {
        pcVar21 = "The linear solver\'s init routine failed.";
        iVar5 = -5;
        iVar4 = -5;
        goto LAB_00513317;
      }
      iVar5 = cvNlsInit((CVodeMem)cvode_mem);
      if (iVar5 != 0) {
        pcVar21 = "The nonlinear solver\'s init routine failed.";
        iVar5 = -0xd;
        iVar4 = -0xd;
        goto LAB_00513317;
      }
      if ((*(int *)((long)cvode_mem + 0x5f8) != 0) && (*(long *)((long)cvode_mem + 0x5f0) == 0)) {
        pcVar21 = "proj_mem = NULL illegal.";
        iVar5 = -0x1d;
        iVar4 = -0x1d;
        goto LAB_00513317;
      }
      iVar5 = 0;
      bVar24 = true;
      if (*(CVodeProjMem *)((long)cvode_mem + 0x5f0) != (CVodeProjMem)0x0) {
        iVar4 = cvProjInit(*(CVodeProjMem *)((long)cvode_mem + 0x5f0));
        if (iVar4 != 0) {
          pcVar21 = "A memory request failed.";
          iVar5 = -0x14;
          iVar4 = -0x14;
          goto LAB_00513317;
        }
        *(undefined4 *)((long)cvode_mem + 0x5fc) = 0;
      }
    }
    if (!bVar24) {
      return iVar5;
    }
    iVar5 = (**(code **)((long)cvode_mem + 0x10))
                      (*(undefined8 *)((long)cvode_mem + 0x168),
                       *(undefined8 *)((long)cvode_mem + 0x60),
                       *(undefined8 *)((long)cvode_mem + 0x68),
                       *(undefined8 *)((long)cvode_mem + 0x18));
    *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
    if (iVar5 < 0) {
      pcVar21 = "CVode";
      msgfmt = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
      iVar5 = -8;
      iVar4 = -8;
      goto LAB_005135ff;
    }
    if (iVar5 != 0) {
      pcVar21 = "The right-hand side routine failed at the first call.";
      iVar5 = -9;
      iVar4 = -9;
      goto LAB_00510c4f;
    }
    if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
       ((local_420 - *(double *)((long)cvode_mem + 0x168)) *
        (*(double *)((long)cvode_mem + 0x118) - *(double *)((long)cvode_mem + 0x168)) <= 0.0))
    goto LAB_00513630;
    auVar32._0_8_ = *(double *)((long)cvode_mem + 0x138);
    *(double *)((long)cvode_mem + 0x140) = auVar32._0_8_;
    if (((auVar32._0_8_ == 0.0) && (!NAN(auVar32._0_8_))) ||
       (0.0 <= (local_420 - *(double *)((long)cvode_mem + 0x168)) * auVar32._0_8_)) {
      if ((auVar32._0_8_ == 0.0) && (!NAN(auVar32._0_8_))) {
        rVar25 = local_420;
        if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
           (0.0 < (local_420 - *(double *)((long)cvode_mem + 0x118)) *
                  (local_420 - *(double *)((long)cvode_mem + 0x168)))) {
          rVar25 = *(double *)((long)cvode_mem + 0x118);
        }
        iVar5 = cvHin((CVodeMem)cvode_mem,rVar25);
        if (iVar5 != 0) {
          iVar5 = cvHandleFailure((CVodeMem)cvode_mem,iVar5);
          return iVar5;
        }
      }
      auVar32._0_8_ =
           ABS(*(double *)((long)cvode_mem + 0x140)) * *(double *)((long)cvode_mem + 0x2f0);
      if (1.0 < auVar32._0_8_) {
        *(double *)((long)cvode_mem + 0x140) = *(double *)((long)cvode_mem + 0x140) / auVar32._0_8_;
      }
      auVar32._0_8_ = ABS(*(double *)((long)cvode_mem + 0x140));
      if (auVar32._0_8_ < *(double *)((long)cvode_mem + 0x2e8)) {
        *(double *)((long)cvode_mem + 0x140) =
             *(double *)((long)cvode_mem + 0x140) *
             (*(double *)((long)cvode_mem + 0x2e8) / auVar32._0_8_);
      }
      if (*(int *)((long)cvode_mem + 0x110) != 0) {
        if (0.0 < ((*(double *)((long)cvode_mem + 0x168) + *(double *)((long)cvode_mem + 0x140)) -
                  *(double *)((long)cvode_mem + 0x118)) * *(double *)((long)cvode_mem + 0x140)) {
          *(double *)((long)cvode_mem + 0x140) =
               (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) *
               (*(double *)((long)cvode_mem + 0x118) - *(double *)((long)cvode_mem + 0x168));
        }
      }
      rVar25 = *(realtype *)((long)cvode_mem + 0x140);
      *(realtype *)((long)cvode_mem + 0x160) = rVar25;
      *(realtype *)((long)cvode_mem + 0x430) = rVar25;
      *(realtype *)((long)cvode_mem + 0x148) = rVar25;
      N_VScale(rVar25,*(N_Vector *)((long)cvode_mem + 0x68),*(N_Vector *)((long)cvode_mem + 0x68));
      if ((*(int *)((long)cvode_mem + 0x578) < 1) ||
         (iVar5 = cvRcheck1((CVodeMem)cvode_mem), iVar5 != -0xc)) goto LAB_00510c93;
      pcVar21 = "cvRcheck1";
      goto LAB_005135eb;
    }
    pcVar21 = "h0 and tout - t0 inconsistent.";
  }
  iVar5 = -0x16;
  iVar4 = -0x16;
LAB_00510c4f:
  cvProcessError((CVodeMem)cvode_mem,iVar4,"CVODE","CVode",pcVar21);
  return iVar5;
LAB_00512b13:
  bVar24 = false;
LAB_00512cb6:
  if (bVar24) {
    *(int *)((long)cvode_mem + 0x124) = iVar5 + -1;
    auVar32._0_8_ = *(double *)((long)cvode_mem + 0x398);
    if (*(double *)((long)cvode_mem + 0x2f8) <= *(double *)((long)cvode_mem + 0x398)) {
      auVar32._0_8_ = *(double *)((long)cvode_mem + 0x2f8);
    }
    dVar30 = ABS(*(double *)((long)cvode_mem + 0x140)) * *(double *)((long)cvode_mem + 0x2f0) *
             auVar32._0_8_;
    dVar29 = 1.0;
    if (1.0 <= dVar30) {
      dVar29 = dVar30;
    }
    *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_ / dVar29;
    *(double *)((long)cvode_mem + 0x148) =
         (auVar32._0_8_ / dVar29) * *(double *)((long)cvode_mem + 0x140);
    *(long *)((long)cvode_mem + 0x568) = *(long *)((long)cvode_mem + 0x568) + 1;
  }
LAB_00512d17:
  *(undefined8 *)((long)cvode_mem + 0x2f8) =
       *(undefined8 *)
        ((long)cvode_mem +
        (ulong)(*(long *)((long)cvode_mem + 0x348) < *(long *)((long)cvode_mem + 0x358)) * 8 + 0x318
        );
  N_VScale(*(realtype *)((long)cvode_mem + 0x1f8),*(N_Vector *)((long)cvode_mem + 0xd8),
           *(N_Vector *)((long)cvode_mem + 0xd8));
  iVar4 = 0;
LAB_00512d5e:
  lVar23 = local_378;
  if (iVar4 != 0) {
    iVar5 = cvHandleFailure((CVodeMem)cvode_mem,iVar4);
LAB_0051369e:
    rVar25 = *(realtype *)((long)cvode_mem + 0x168);
    *local_418 = rVar25;
    *(realtype *)((long)cvode_mem + 0x170) = rVar25;
    N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),local_410);
    return iVar5;
  }
  if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
     (ABS(*(double *)((long)cvode_mem + 0x168) - *(double *)((long)cvode_mem + 0x118)) <=
      (ABS(*(double *)((long)cvode_mem + 0x140)) + ABS(*(double *)((long)cvode_mem + 0x168))) *
      *(double *)((long)cvode_mem + 8) * 100.0)) {
    *(double *)((long)cvode_mem + 0x168) = *(double *)((long)cvode_mem + 0x118);
  }
  if (0 < *(int *)((long)cvode_mem + 0x578)) {
    iVar5 = cvRcheck3((CVodeMem)cvode_mem);
    if (iVar5 == -0xc) goto LAB_005135d5;
    if (iVar5 == 1) {
      *(undefined4 *)((long)cvode_mem + 0x5d4) = 1;
      rVar25 = *(realtype *)((long)cvode_mem + 0x590);
      *local_418 = rVar25;
      goto LAB_005139a3;
    }
    if (*(long *)((long)cvode_mem + 0x358) == 1) {
      uVar7 = (ulong)*(int *)((long)cvode_mem + 0x578);
      bVar24 = 0 < (long)uVar7;
      if ((0 < (long)uVar7) && (**(int **)((long)cvode_mem + 0x5e0) != 0)) {
        uVar8 = 1;
        do {
          uVar18 = uVar8;
          if (uVar7 == uVar18) break;
          uVar8 = uVar18 + 1;
        } while ((*(int **)((long)cvode_mem + 0x5e0))[uVar18] != 0);
        bVar24 = uVar18 < uVar7;
      }
      if ((bVar24) && (0 < *(int *)((long)cvode_mem + 0x5e8))) {
        cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                       "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                      );
      }
    }
  }
  if (((int)local_3a0 == 1) &&
     (0.0 <= (*(double *)((long)cvode_mem + 0x168) - local_420) *
             *(double *)((long)cvode_mem + 0x140))) {
    *local_418 = local_420;
    *(realtype *)((long)cvode_mem + 0x170) = local_420;
    CVodeGetDky(cvode_mem,local_420,0,local_410);
    *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x124);
    *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x148);
    return 0;
  }
  if (*(int *)((long)cvode_mem + 0x110) != 0) {
    auVar32._0_8_ = *(double *)((long)cvode_mem + 0x118);
    dVar29 = *(double *)((long)cvode_mem + 0x168);
    dVar30 = *(double *)((long)cvode_mem + 0x140);
    if (ABS(dVar29 - auVar32._0_8_) <=
        (ABS(dVar30) + ABS(dVar29)) * *(double *)((long)cvode_mem + 8) * 100.0) {
      CVodeGetDky(cvode_mem,auVar32._0_8_,0,local_410);
      rVar25 = *(realtype *)((long)cvode_mem + 0x118);
      *local_418 = rVar25;
      goto LAB_0051396f;
    }
    if (0.0 < ((*(double *)((long)cvode_mem + 0x148) + dVar29) - auVar32._0_8_) * dVar30) {
      auVar32._0_8_ = (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) * (auVar32._0_8_ - dVar29);
      *(double *)((long)cvode_mem + 0x148) = auVar32._0_8_;
      *(double *)((long)cvode_mem + 0x158) = auVar32._0_8_ / dVar30;
    }
  }
  lVar23 = lVar23 + 1;
  if ((int)local_3a0 == 2) {
    rVar25 = *(realtype *)((long)cvode_mem + 0x168);
    *local_418 = rVar25;
    *(realtype *)((long)cvode_mem + 0x170) = rVar25;
    N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),local_410);
    *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x124);
    *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x148);
    return 0;
  }
  goto LAB_00511039;
}

Assistant:

int CVode(void *cvode_mem, realtype tout, N_Vector yout,
          realtype *tret, int itask)
{
  CVodeMem cv_mem;
  long int nstloc;
  int retval, hflag, kflag, istate, ir, ier, irfndp;
  int ewtsetOK;
  realtype troundoff, tout_hin, rh, nrm;
  booleantype inactive_roots;

  /*
   * -------------------------------------
   * 1. Check and process inputs
   * -------------------------------------
   */

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */
  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVode", MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((cv_mem->cv_y = yout) == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_YOUT_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != CV_NORMAL) && (itask != CV_ONE_STEP) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  if (itask == CV_NORMAL) cv_mem->cv_toutc = tout;
  cv_mem->cv_taskc = itask;

  /*
   * ----------------------------------------
   * 2. Initializations performed only at
   *    the first step (nst=0):
   *    - initial setup
   *    - initialize Nordsieck history array
   *    - compute initial step size
   *    - check for approach to tstop
   *    - check for approach to a root
   * ----------------------------------------
   */

  if (cv_mem->cv_nst == 0) {

    cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;

    /* Check inputs for corectness */

    ier = cvInitialSetup(cv_mem);
    if (ier != CV_SUCCESS) {
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(ier);
    }

    /* Call f at (t0,y0), set zn[1] = y'(t0). */

    retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0],
                          cv_mem->cv_zn[1], cv_mem->cv_user_data);
    cv_mem->cv_nfe++;
    if (retval < 0) {
      cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_RHSFUNC_FAIL);
    }
    if (retval > 0) {
      cvProcessError(cv_mem, CV_FIRST_RHSFUNC_ERR, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FIRST);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_FIRST_RHSFUNC_ERR);
    }

    /* Test input tstop for legality. */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tstop - cv_mem->cv_tn)*(tout - cv_mem->cv_tn) <= ZERO ) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
    }

    /* Set initial h (from H0 or cvHin). */

    cv_mem->cv_h = cv_mem->cv_hin;
    if ( (cv_mem->cv_h != ZERO) && ((tout-cv_mem->cv_tn)*cv_mem->cv_h < ZERO) ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_H0);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_ILL_INPUT);
    }
    if (cv_mem->cv_h == ZERO) {
      tout_hin = tout;
      if ( cv_mem->cv_tstopset &&
           (tout-cv_mem->cv_tn)*(tout-cv_mem->cv_tstop) > ZERO )
        tout_hin = cv_mem->cv_tstop;
      hflag = cvHin(cv_mem, tout_hin);
      if (hflag != CV_SUCCESS) {
        istate = cvHandleFailure(cv_mem, hflag);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(istate);
      }
    }

    /* Enforce hmax and hmin */

    rh = SUNRabs(cv_mem->cv_h)*cv_mem->cv_hmax_inv;
    if (rh > ONE) cv_mem->cv_h /= rh;
    if (SUNRabs(cv_mem->cv_h) < cv_mem->cv_hmin)
      cv_mem->cv_h *= cv_mem->cv_hmin/SUNRabs(cv_mem->cv_h);

    /* Check for approach to tstop */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tn + cv_mem->cv_h - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO )
        cv_mem->cv_h = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
    }

    /* Scale zn[1] by h.*/

    cv_mem->cv_hscale = cv_mem->cv_h;
    cv_mem->cv_h0u    = cv_mem->cv_h;
    cv_mem->cv_hprime = cv_mem->cv_h;

    N_VScale(cv_mem->cv_h, cv_mem->cv_zn[1], cv_mem->cv_zn[1]);

    /* Check for zeros of root function g at and near t0. */

    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck1(cv_mem);

      if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck1",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      }

    }

  } /* end of first call block */

  /*
   * ------------------------------------------------------
   * 3. At following steps, perform stop tests:
   *    - check for root in last step
   *    - check if we passed tstop
   *    - check if we passed tout (NORMAL mode)
   *    - check if current tn was returned (ONE_STEP mode)
   *    - check if we are close to tstop
   *      (adjust step size if needed)
   * -------------------------------------------------------
   */

  if (cv_mem->cv_nst > 0) {

    /* Estimate an infinitesimal time interval to be used as
       a roundoff for time quantities (based on current time
       and step size) */
    troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
      (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));

    /* First, check for a root in the last step taken, other than the
       last root found, if any.  If itask = CV_ONE_STEP and y(tn) was not
       returned because of an intervening root, return y(tn) now.     */
    if (cv_mem->cv_nrtfn > 0) {

      irfndp = cv_mem->cv_irfnd;

      retval = cvRcheck2(cv_mem);

      if (retval == CLOSERT) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "cvRcheck2",
                       MSGCV_CLOSE_ROOTS, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      } else if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck2",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      } else if (retval == RTFOUND) {
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ROOT_RETURN);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {

        retval = cvRcheck3(cv_mem);

        if (retval == CV_SUCCESS) {     /* no root found */
          cv_mem->cv_irfnd = 0;
          if ((irfndp == 1) && (itask == CV_ONE_STEP)) {
            cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
            N_VScale(ONE, cv_mem->cv_zn[0], yout);
            SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
            return(CV_SUCCESS);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          cv_mem->cv_irfnd = 1;
          cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ROOT_RETURN);
        } else if (retval == CV_RTFUNC_FAIL) {  /* g failed */
          cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                         MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_RTFUNC_FAIL);
        }

      }

    } /* end of root stop check */

    /* In CV_NORMAL mode, test if tout was reached */
    if ( (itask == CV_NORMAL) && ((cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO) ) {
      cv_mem->cv_tretlast = *tret = tout;
      ier =  CVodeGetDky(cv_mem, tout, 0, yout);
      if (ier != CV_SUCCESS) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TOUT, tout);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* In CV_ONE_STEP mode, test if tn was returned */
    if ( itask == CV_ONE_STEP &&
         SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* Test for tn at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff ) {
        ier =  CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        if (ier != CV_SUCCESS) {
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ILL_INPUT);
        }
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_TSTOP_RETURN);
      }

      /* If next step would overtake tstop, adjust stepsize */
      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

  } /* end stopping tests block */

  /*
   * --------------------------------------------------
   * 4. Looping point for internal steps
   *
   *    4.1. check for errors (too many steps, too much
   *         accuracy requested, step size too small)
   *    4.2. take a new step (call cvStep)
   *    4.3. stop on error
   *    4.4. perform stop tests:
   *         - check for root in last step
   *         - check if tout was passed
   *         - check if close to tstop
   *         - check if in ONE_STEP mode (must return)
   * --------------------------------------------------
   */

  nstloc = 0;
  for(;;) {

    cv_mem->cv_next_h = cv_mem->cv_h;
    cv_mem->cv_next_q = cv_mem->cv_q;

    /* Reset and check ewt */
    if (cv_mem->cv_nst > 0) {

      ewtsetOK = cv_mem->cv_efun(cv_mem->cv_zn[0], cv_mem->cv_ewt, cv_mem->cv_e_data);

      if (ewtsetOK != 0) {

        if (cv_mem->cv_itol == CV_WF)
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_FAIL, cv_mem->cv_tn);
        else
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_BAD, cv_mem->cv_tn);

        istate = CV_ILL_INPUT;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
        N_VScale(ONE, cv_mem->cv_zn[0], yout);
        break;
      }
    }

    /* Check for too many steps */
    if ( (cv_mem->cv_mxstep>0) && (nstloc >= cv_mem->cv_mxstep) ) {
      cvProcessError(cv_mem, CV_TOO_MUCH_WORK, "CVODE", "CVode",
                     MSGCV_MAX_STEPS, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_WORK;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(cv_mem->cv_zn[0], cv_mem->cv_ewt);
    cv_mem->cv_tolsf = cv_mem->cv_uround * nrm;
    if (cv_mem->cv_tolsf > ONE) {
      cvProcessError(cv_mem, CV_TOO_MUCH_ACC, "CVODE", "CVode",
                     MSGCV_TOO_MUCH_ACC, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_ACC;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_tolsf *= TWO;
      break;
    } else {
      cv_mem->cv_tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (cv_mem->cv_tn + cv_mem->cv_h == cv_mem->cv_tn) {
      cv_mem->cv_nhnil++;
      if (cv_mem->cv_nhnil <= cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL,
                       cv_mem->cv_tn, cv_mem->cv_h);
      if (cv_mem->cv_nhnil == cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL_DONE);
    }

    /* Call cvStep to take a step */
    kflag = cvStep(cv_mem);

    /* Process failed step cases, and exit loop */
    if (kflag != CV_SUCCESS) {
      istate = cvHandleFailure(cv_mem, kflag);
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    nstloc++;

    /* If tstop is set and was reached, reset tn = tstop */
    if ( cv_mem->cv_tstopset ) {
      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff)
        cv_mem->cv_tn = cv_mem->cv_tstop;
    }

    /* Check for root in last step taken. */
    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck3(cv_mem);

      if (retval == RTFOUND) {  /* A new root was found */
        cv_mem->cv_irfnd = 1;
        istate = CV_ROOT_RETURN;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        break;
      } else if (retval == CV_RTFUNC_FAIL) { /* g failed */
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        istate = CV_RTFUNC_FAIL;
        break;
      }

      /* If we are at the end of the first step and we still have
       * some event functions that are inactive, issue a warning
       * as this may indicate a user error in the implementation
       * of the root function. */

      if (cv_mem->cv_nst==1) {
        inactive_roots = SUNFALSE;
        for (ir=0; ir<cv_mem->cv_nrtfn; ir++) {
          if (!cv_mem->cv_gactive[ir]) {
            inactive_roots = SUNTRUE;
            break;
          }
        }
        if ((cv_mem->cv_mxgnull > 0) && inactive_roots) {
          cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode",
                         MSGCV_INACTIVE_ROOTS);
        }
      }

    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == CV_NORMAL) &&  (cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO ) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = tout;
      (void) CVodeGetDky(cv_mem, tout, 0, yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff) {
        (void) CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        istate = CV_TSTOP_RETURN;
        break;
      }

      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == CV_ONE_STEP) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

  } /* end looping for internal steps */


  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return(istate);
}